

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::_valid_subcommand(App *this,string *current,bool ignore_used)

{
  byte bVar1;
  size_type sVar2;
  App *pAVar3;
  byte in_DL;
  App *in_RSI;
  long in_RDI;
  App *com;
  undefined1 in_stack_0000001e;
  bool local_32;
  bool local_31;
  undefined8 in_stack_ffffffffffffffd8;
  undefined1 ignore_used_00;
  undefined7 in_stack_ffffffffffffffe0;
  bool local_1;
  
  ignore_used_00 = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  bVar1 = in_DL & 1;
  if ((*(long *)(in_RDI + 0x2f0) != 0) &&
     (sVar2 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)(in_RDI + 0x1e8)),
     *(ulong *)(in_RDI + 0x2f0) <= sVar2)) {
    local_31 = false;
    if (*(long *)(in_RDI + 0x308) != 0) {
      local_31 = _valid_subcommand(in_RSI,(string *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                                   (bool)ignore_used_00);
    }
    return local_31;
  }
  pAVar3 = _find_subcommand(this,current,ignore_used,(bool)in_stack_0000001e);
  if (pAVar3 == (App *)0x0) {
    local_32 = false;
    if (*(long *)(in_RDI + 0x308) != 0) {
      local_32 = _valid_subcommand(in_RSI,(string *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),false)
      ;
    }
    local_1 = local_32;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool App::_valid_subcommand(const std::string &current, bool ignore_used) const {
    // Don't match if max has been reached - but still check parents
    if(require_subcommand_max_ != 0 && parsed_subcommands_.size() >= require_subcommand_max_) {
        return parent_ != nullptr && parent_->_valid_subcommand(current, ignore_used);
    }
    auto *com = _find_subcommand(current, true, ignore_used);
    if(com != nullptr) {
        return true;
    }
    // Check parent if exists, else return false
    return parent_ != nullptr && parent_->_valid_subcommand(current, ignore_used);
}